

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O2

void __thiscall
IndexIntervalTest_ValuesSetInConstructor_Test::TestBody
          (IndexIntervalTest_ValuesSetInConstructor_Test *this)

{
  Int3 *_begin;
  Int3 *_end;
  Int3 *_step;
  char *pcVar1;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertionResult gtest_ar;
  IndexInterval<pica::Vector3<int>_> interval;
  
  _begin = &(this->super_IndexIntervalTest).begin;
  _end = &(this->super_IndexIntervalTest).end;
  _step = &(this->super_IndexIntervalTest).step;
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval(&interval,_begin,_end,_step);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"begin.x","interval.begin.x",&_begin->x,(int *)&interval);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
               ,0x73,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"begin.y","interval.begin.y",
               &(this->super_IndexIntervalTest).begin.y,&interval.begin.y);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_88);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                 ,0x73,pcVar1);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"begin.z","interval.begin.z",
                 &(this->super_IndexIntervalTest).begin.z,&interval.begin.z);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_88);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                   ,0x73,pcVar1);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"end.x","interval.end.x",&_end->x,&interval.end.x);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_88);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                     ,0x74,pcVar1);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"end.y","interval.end.y",
                     &(this->super_IndexIntervalTest).end.y,&interval.end.y);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_88);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                       ,0x74,pcVar1);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"end.z","interval.end.z",
                       &(this->super_IndexIntervalTest).end.z,&interval.end.z);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_88);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_90,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                         ,0x74,pcVar1);
              testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"step.x","interval.step.x",&_step->x,&interval.step.x
                        );
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_88);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                           ,0x75,pcVar1);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"step.y","interval.step.y",
                           &(this->super_IndexIntervalTest).step.y,&interval.step.y);
                if (gtest_ar.success_ != false) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"step.z","interval.step.z",
                             &(this->super_IndexIntervalTest).step.z,&interval.step.z);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_88);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                               ,0x75,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&local_88);
                  }
                  goto LAB_001ac05d;
                }
                testing::Message::Message((Message *)&local_88);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                           ,0x75,pcVar1);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_88);
LAB_001ac05d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(IndexIntervalTest, ValuesSetInConstructor)
{
    IndexInterval<Int3> interval(begin, end, step);
    ASSERT_EQ_INT3(begin, interval.begin);
    ASSERT_EQ_INT3(end, interval.end);
    ASSERT_EQ_INT3(step, interval.step);
}